

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QRenderRule::drawBorderImage(QRenderRule *this,QPainter *p,QRect *rect)

{
  QStyleSheetBorderImageData *pQVar1;
  QRect *in_RDX;
  QPoint *in_RSI;
  RenderHint RVar2;
  long in_FS_OFFSET;
  bool wasSmoothPixmapTransform;
  int *sourceBorders;
  int *targetBorders;
  QStyleSheetBorderImageData *borderImageData;
  QMargins targetMargins;
  QMargins sourceMargins;
  QMargins *in_stack_00000258;
  QRect *in_stack_00000260;
  QPixmap *in_stack_00000268;
  QMargins *in_stack_00000270;
  QRect *in_stack_00000278;
  QPainter *in_stack_00000280;
  QFlagsStorage<QDrawBorderPixmap::DrawingHint> in_stack_0000031c;
  QTileRules *in_stack_00000ee0;
  undefined8 in_stack_ffffffffffffff08;
  QTileRules *this_00;
  int in_stack_ffffffffffffff10;
  undefined4 uVar3;
  int in_stack_ffffffffffffff14;
  QPainter *in_stack_ffffffffffffff18;
  QRenderRule *in_stack_ffffffffffffff20;
  QTileRules local_58;
  undefined8 local_50;
  undefined4 local_30;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_2c;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  RVar2 = (RenderHint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  setClip(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
          (QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  border((QRenderRule *)0x423d40);
  pQVar1 = QStyleSheetBorderData::borderImage((QStyleSheetBorderData *)0x423d48);
  border((QRenderRule *)0x423d57);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMargins::QMargins((QMargins *)in_stack_ffffffffffffff20,
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QMargins::QMargins((QMargins *)in_stack_ffffffffffffff20,
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  local_30 = QPainter::renderHints();
  local_2c.super_QFlagsStorage<QPainter::RenderHint>.i =
       (QFlagsStorage<QPainter::RenderHint>)
       QFlags<QPainter::RenderHint>::operator&
                 ((QFlags<QPainter::RenderHint> *)
                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),RVar2);
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
  RVar2 = (RenderHint)in_RSI;
  QPainter::setRenderHint(RVar2,true);
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_50 = QPixmap::size();
  QRect::QRect(in_RDX,in_RSI,(QSize *)in_stack_ffffffffffffff20);
  this_00 = &local_58;
  QTileRules::QTileRules
            (this_00,drawBorderImage::tileMode2TileRule[pQVar1->horizStretch],
             drawBorderImage::tileMode2TileRule[pQVar1->vertStretch]);
  QFlags<QDrawBorderPixmap::DrawingHint>::QFlags((QFlags<QDrawBorderPixmap::DrawingHint> *)0x423ee0)
  ;
  uVar3 = 0;
  qDrawBorderPixmap(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                    in_stack_00000260,in_stack_00000258,in_stack_00000ee0,
                    (DrawingHints)in_stack_0000031c.i);
  QPainter::setRenderHint(RVar2,true);
  unsetClip((QRenderRule *)CONCAT44(in_stack_ffffffffffffff14,uVar3),(QPainter *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::drawBorderImage(QPainter *p, const QRect& rect)
{
    setClip(p, rect);
    static const Qt::TileRule tileMode2TileRule[] = {
        Qt::StretchTile, Qt::RoundTile, Qt::StretchTile, Qt::RepeatTile, Qt::StretchTile };

    const QStyleSheetBorderImageData *borderImageData = border()->borderImage();
    const int *targetBorders = border()->borders;
    const int *sourceBorders = borderImageData->cuts;
    QMargins sourceMargins(sourceBorders[LeftEdge], sourceBorders[TopEdge],
                           sourceBorders[RightEdge], sourceBorders[BottomEdge]);
    QMargins targetMargins(targetBorders[LeftEdge], targetBorders[TopEdge],
                           targetBorders[RightEdge], targetBorders[BottomEdge]);

    bool wasSmoothPixmapTransform = p->renderHints() & QPainter::SmoothPixmapTransform;
    p->setRenderHint(QPainter::SmoothPixmapTransform);
    qDrawBorderPixmap(p, rect, targetMargins, borderImageData->pixmap,
                      QRect(QPoint(), borderImageData->pixmap.size()), sourceMargins,
                      QTileRules(tileMode2TileRule[borderImageData->horizStretch], tileMode2TileRule[borderImageData->vertStretch]));
    p->setRenderHint(QPainter::SmoothPixmapTransform, wasSmoothPixmapTransform);
    unsetClip(p);
}